

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O1

void __thiscall
duckdb::Binder::BindLogicalType
          (Binder *this,LogicalType *type,optional_ptr<duckdb::Catalog,_true> catalog,string *schema
          )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  LogicalTypeId local_51;
  undefined8 local_50;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_50 = &local_51;
  local_51 = USER;
  bVar3 = TypeVisitor::
          Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                    (type,(anon_class_8_1_50811320 *)&local_50);
  if (bVar3) {
    BindLogicalTypeInternal((LogicalType *)&local_50,this,type,catalog,schema);
    _Var2._M_pi = _Stack_40._M_pi;
    peVar1 = local_48;
    type->id_ = (LogicalTypeId)local_50;
    type->physical_type_ = local_50._1_1_;
    uVar4 = *(undefined4 *)
             &(type->type_info_).internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar5 = *(undefined4 *)
             ((long)&(type->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             4);
    uVar6 = *(undefined4 *)
             &(type->type_info_).internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    uVar7 = *(undefined4 *)
             ((long)&(type->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4);
    (type->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (type->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48 = (element_type *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (type->type_info_).internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (type->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (type->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_38 = uVar4;
      uStack_34 = uVar5;
      uStack_30 = uVar6;
      uStack_2c = uVar7;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      uVar4 = local_38;
      uVar5 = uStack_34;
      uVar6 = uStack_30;
      uVar7 = uStack_2c;
    }
    _Var2._M_pi = _Stack_40._M_pi;
    local_48 = (element_type *)CONCAT44(uVar5,uVar4);
    _Stack_40._M_pi._4_4_ = uVar7;
    _Stack_40._M_pi._0_4_ = uVar6;
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)&local_50);
  }
  return;
}

Assistant:

void Binder::BindLogicalType(LogicalType &type, optional_ptr<Catalog> catalog, const string &schema) {
	// check if we need to bind this type at all
	if (!TypeVisitor::Contains(type, LogicalTypeId::USER)) {
		return;
	}
	type = BindLogicalTypeInternal(type, catalog, schema);
}